

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

TextureChannelClass tcu::getTextureChannelClass(ChannelType channelType)

{
  TextureChannelClass local_c;
  ChannelType channelType_local;
  
  switch(channelType) {
  case SNORM_INT8:
    local_c = TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
    break;
  case SNORM_INT16:
    local_c = TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
    break;
  case SNORM_INT32:
    local_c = TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
    break;
  case UNORM_INT8:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_INT16:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_INT24:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_INT32:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_BYTE_44:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_SHORT_565:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_SHORT_555:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_SHORT_4444:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_SHORT_5551:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_SHORT_1555:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNORM_INT_101010:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case SNORM_INT_1010102_REV:
    local_c = TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
    break;
  case UNORM_INT_1010102_REV:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
    break;
  case UNSIGNED_BYTE_44:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case UNSIGNED_SHORT_565:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case UNSIGNED_SHORT_4444:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case UNSIGNED_SHORT_5551:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case SIGNED_INT_1010102_REV:
    local_c = TEXTURECHANNELCLASS_SIGNED_INTEGER;
    break;
  case UNSIGNED_INT_1010102_REV:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    local_c = TEXTURECHANNELCLASS_FLOATING_POINT;
    break;
  case UNSIGNED_INT_999_E5_REV:
    local_c = TEXTURECHANNELCLASS_FLOATING_POINT;
    break;
  case UNSIGNED_INT_16_8_8:
    local_c = TEXTURECHANNELCLASS_LAST;
    break;
  case UNSIGNED_INT_24_8:
    local_c = TEXTURECHANNELCLASS_LAST;
    break;
  case UNSIGNED_INT_24_8_REV:
    local_c = TEXTURECHANNELCLASS_LAST;
    break;
  case SIGNED_INT8:
    local_c = TEXTURECHANNELCLASS_SIGNED_INTEGER;
    break;
  case SIGNED_INT16:
    local_c = TEXTURECHANNELCLASS_SIGNED_INTEGER;
    break;
  case SIGNED_INT32:
    local_c = TEXTURECHANNELCLASS_SIGNED_INTEGER;
    break;
  case UNSIGNED_INT8:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case UNSIGNED_INT16:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case UNSIGNED_INT24:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case UNSIGNED_INT32:
    local_c = TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
    break;
  case HALF_FLOAT:
    local_c = TEXTURECHANNELCLASS_FLOATING_POINT;
    break;
  case FLOAT:
    local_c = TEXTURECHANNELCLASS_FLOATING_POINT;
    break;
  case FLOAT64:
    local_c = TEXTURECHANNELCLASS_FLOATING_POINT;
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    local_c = TEXTURECHANNELCLASS_LAST;
    break;
  default:
    local_c = TEXTURECHANNELCLASS_LAST;
  }
  return local_c;
}

Assistant:

TextureChannelClass getTextureChannelClass (TextureFormat::ChannelType channelType)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (channelType)
	{
		case TextureFormat::SNORM_INT8:						return TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		case TextureFormat::SNORM_INT16:					return TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		case TextureFormat::SNORM_INT32:					return TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		case TextureFormat::UNORM_INT8:						return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_INT16:					return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_INT24:					return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_INT32:					return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_BYTE_44:					return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_SHORT_565:				return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_SHORT_555:				return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_SHORT_4444:				return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_SHORT_5551:				return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNORM_SHORT_1555:				return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::UNSIGNED_BYTE_44:				return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::UNSIGNED_SHORT_565:				return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::UNSIGNED_SHORT_4444:			return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::UNSIGNED_SHORT_5551:			return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::UNORM_INT_101010:				return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::SNORM_INT_1010102_REV:			return TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		case TextureFormat::UNORM_INT_1010102_REV:			return TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
		case TextureFormat::SIGNED_INT_1010102_REV:			return TEXTURECHANNELCLASS_SIGNED_INTEGER;
		case TextureFormat::UNSIGNED_INT_1010102_REV:		return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	return TEXTURECHANNELCLASS_FLOATING_POINT;
		case TextureFormat::UNSIGNED_INT_999_E5_REV:		return TEXTURECHANNELCLASS_FLOATING_POINT;
		case TextureFormat::UNSIGNED_INT_16_8_8:			return TEXTURECHANNELCLASS_LAST;					//!< packed unorm16-x8-uint8
		case TextureFormat::UNSIGNED_INT_24_8:				return TEXTURECHANNELCLASS_LAST;					//!< packed unorm24-uint8
		case TextureFormat::UNSIGNED_INT_24_8_REV:			return TEXTURECHANNELCLASS_LAST;					//!< packed unorm24-uint8
		case TextureFormat::SIGNED_INT8:					return TEXTURECHANNELCLASS_SIGNED_INTEGER;
		case TextureFormat::SIGNED_INT16:					return TEXTURECHANNELCLASS_SIGNED_INTEGER;
		case TextureFormat::SIGNED_INT32:					return TEXTURECHANNELCLASS_SIGNED_INTEGER;
		case TextureFormat::UNSIGNED_INT8:					return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::UNSIGNED_INT16:					return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::UNSIGNED_INT24:					return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::UNSIGNED_INT32:					return TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		case TextureFormat::HALF_FLOAT:						return TEXTURECHANNELCLASS_FLOATING_POINT;
		case TextureFormat::FLOAT:							return TEXTURECHANNELCLASS_FLOATING_POINT;
		case TextureFormat::FLOAT64:						return TEXTURECHANNELCLASS_FLOATING_POINT;
		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	return TEXTURECHANNELCLASS_LAST;					//!< packed float32-pad24-uint8
		default:
			DE_FATAL("Unknown channel type");
			return TEXTURECHANNELCLASS_LAST;
	}
}